

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall t_cpp_generator::generate_service_helpers(t_cpp_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *force_cpp_out;
  t_struct *tstruct;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ofstream_with_content_based_conditional_update *out;
  pointer pptVar2;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string name_orig;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&functions,&tservice->functions_)
  ;
  force_cpp_out = &this->f_service_;
  out = &this->f_service_tcc_;
  if (this->gen_templates_ == false) {
    out = force_cpp_out;
  }
  for (pptVar2 = functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar2 !=
      functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar2 = pptVar2 + 1) {
    tstruct = (*pptVar2)->arglist_;
    iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    std::__cxx11::string::string((string *)&name_orig,(string *)CONCAT44(extraout_var,iVar1));
    iVar1 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::operator+(&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var_00,iVar1),"_");
    std::operator+(&local_50,&local_70,&(*pptVar2)->name_);
    std::operator+(&local_b0,&local_50,"_args");
    (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[2])(tstruct,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    generate_struct_declaration
              (this,(ostream *)&this->f_header_,tstruct,false,false,true,true,false,false);
    generate_struct_definition(this,(ostream *)out,(ostream *)force_cpp_out,tstruct,false,false);
    generate_struct_reader(this,(ostream *)out,tstruct,false);
    generate_struct_writer(this,(ostream *)out,tstruct,false);
    iVar1 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::operator+(&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var_01,iVar1),"_");
    std::operator+(&local_50,&local_70,&(*pptVar2)->name_);
    std::operator+(&local_b0,&local_50,"_pargs");
    (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[2])(tstruct,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    generate_struct_declaration
              (this,(ostream *)&this->f_header_,tstruct,false,true,false,true,false,false);
    generate_struct_definition(this,(ostream *)out,(ostream *)force_cpp_out,tstruct,false,false);
    generate_struct_writer(this,(ostream *)out,tstruct,true);
    (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[2])(tstruct,&name_orig);
    generate_function_helpers(this,tservice,*pptVar2);
    std::__cxx11::string::~string((string *)&name_orig);
  }
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base
            (&functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>);
  return;
}

Assistant:

void t_cpp_generator::generate_service_helpers(t_service* tservice) {
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  std::ostream& out = (gen_templates_ ? f_service_tcc_ : f_service_);

  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    t_struct* ts = (*f_iter)->get_arglist();
    string name_orig = ts->get_name();

    // TODO(dreiss): Why is this stuff not in generate_function_helpers?
    ts->set_name(tservice->get_name() + "_" + (*f_iter)->get_name() + "_args");
    generate_struct_declaration(f_header_, ts, false);
    generate_struct_definition(out, f_service_, ts, false);
    generate_struct_reader(out, ts);
    generate_struct_writer(out, ts);
    ts->set_name(tservice->get_name() + "_" + (*f_iter)->get_name() + "_pargs");
    generate_struct_declaration(f_header_, ts, false, true, false, true);
    generate_struct_definition(out, f_service_, ts, false);
    generate_struct_writer(out, ts, true);
    ts->set_name(name_orig);

    generate_function_helpers(tservice, *f_iter);
  }
}